

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::GeomBasisCurves::Type>::TypedAttributeWithFallback
          (TypedAttributeWithFallback<tinyusdz::GeomBasisCurves::Type> *this,Type *fallback)

{
  AttrMetas::AttrMetas(&this->_metas);
  (this->_attrib).contained = (storage_t<tinyusdz::GeomBasisCurves::Type>)0x0;
  this->_empty = false;
  (this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  this->_fallback = *fallback;
  this->_blocked = false;
  return;
}

Assistant:

TypedAttributeWithFallback(const T &fallback) : _fallback(fallback) {}